

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_future_result(green_future_t future,void **p,int *i)

{
  int iVar1;
  
  if (future == (green_future_t)0x0) {
    iVar1 = 1;
  }
  else {
    if (future->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x27d);
      fflush(_stderr);
      abort();
    }
    if (future->state == green_future_pending) {
      iVar1 = 3;
    }
    else {
      if (future->state != green_future_aborted) {
        if (p != (void **)0x0) {
          *p = (future->result).p;
        }
        if (i != (int *)0x0) {
          *i = (future->result).i;
        }
        return 0;
      }
      iVar1 = 8;
    }
  }
  return iVar1;
}

Assistant:

int green_future_result(green_future_t future, void ** p, int * i)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);

    if (future->state == green_future_pending) {
        return GREEN_EBUSY;
    }
    if (future->state == green_future_aborted) {
        return GREEN_EBADFD;
    }
    if (p) {
        *p = future->result.p;
    }
    if (i) {
        *i = future->result.i;
    }
    return GREEN_SUCCESS;
}